

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorCommon.cxx
# Opt level: O3

string * utilStripCR(string *__return_storage_ptr__,string *line)

{
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  string *extraout_RAX;
  
  lVar2 = std::__cxx11::string::find((char)line,0xd);
  if (lVar2 != -1) {
    psVar3 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
    return psVar3;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (line->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + line->_M_string_length);
  return extraout_RAX;
}

Assistant:

static std::string utilStripCR(std::string const& line)
{
  // Strip CR characters rcc may have printed (possibly more than one!).
  std::string::size_type cr = line.find('\r');
  if (cr != std::string::npos) {
    return line.substr(0, cr);
  }
  return line;
}